

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpUtils.h
# Opt level: O1

int recvsimplehttpresp(SOCKET sock,int *pStatus,char **pszStatus,char **pContentType,
                      int *pContentLength,char **pContent,int maxrecvbuflen,int *pBytesReceived)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  ssize_t sVar7;
  char *pcVar8;
  size_t __n;
  ulong uVar9;
  double httpver;
  undefined8 local_38;
  
  uVar9 = 0;
  local_38 = 0;
  *pStatus = 0;
  *pszStatus = (char *)0x0;
  *pContentType = (char *)0x0;
  *pContentLength = 0;
  *pContent = (char *)0x0;
  *pBytesReceived = 0;
  pcVar5 = (char *)calloc((long)(maxrecvbuflen + 1),1);
  if (pcVar5 == (char *)0x0) {
    return 6;
  }
  do {
    iVar2 = (int)uVar9;
    if ((0 < iVar2) && (pcVar6 = strstr(pcVar5,"\r\n\r\n"), pcVar6 != (char *)0x0)) {
      iVar4 = 0;
      bVar1 = true;
      goto LAB_00166f9a;
    }
    if (maxrecvbuflen <= iVar2) {
      iVar4 = 6;
      bVar1 = false;
      goto LAB_00166f9a;
    }
    bVar1 = false;
    sVar7 = recv(sock,pcVar5 + uVar9,1,0);
    iVar4 = (int)sVar7;
    if (iVar4 < 0) {
      iVar4 = 1;
      goto LAB_00166f9a;
    }
    uVar9 = (ulong)(uint)(iVar2 + iVar4);
  } while (iVar4 != 0);
  bVar1 = false;
  iVar4 = 2;
LAB_00166f9a:
  *pBytesReceived = iVar2;
  if (!bVar1) {
LAB_00167056:
    free(pcVar5);
    return iVar4;
  }
  pcVar6 = strstr(pcVar5,"HTTP/");
  if (pcVar6 != (char *)0x0) {
    pcVar8 = (char *)calloc(0x100,1);
    *pszStatus = pcVar8;
    if (pcVar8 == (char *)0x0) goto LAB_00167159;
    iVar2 = __isoc99_sscanf(pcVar6,"HTTP/%lf %d %[^\r\n]255s",&local_38,pStatus,pcVar8);
    if (iVar2 == 3) {
      pcVar6 = strstr(pcVar6,"Content-Type: ");
      if (pcVar6 == (char *)0x0) {
        pcVar8 = (char *)0x0;
        __n = 0;
      }
      else {
        pcVar6 = pcVar6 + 0xe;
        pcVar8 = strstr(pcVar6,"\r\n");
        if (pcVar8 == (char *)0x0) {
          pcVar8 = (char *)0x0;
          __n = 0;
        }
        else {
          uVar3 = (int)pcVar8 - (int)pcVar6;
          pcVar8 = (char *)0x0;
          if (-1 < (int)uVar3) {
            pcVar8 = pcVar6;
          }
          __n = (ulong)uVar3;
          if ((int)uVar3 < 1) {
            __n = 0;
          }
        }
      }
      if (pcVar8 != (char *)0x0) {
        pcVar6 = (char *)calloc((ulong)((int)__n + 1),1);
        *pContentType = pcVar6;
        if (pcVar6 == (char *)0x0) {
          free(*pszStatus);
LAB_00167159:
          free(pcVar5);
          return 6;
        }
        memcpy(pcVar6,pcVar8,__n);
        pcVar8 = strstr(pcVar5,"Content-Length: ");
        if (pcVar8 == (char *)0x0) {
          free(pcVar6);
          free(*pszStatus);
          free(pcVar5);
          return 0;
        }
        iVar2 = __isoc99_sscanf(pcVar8,"Content-Length: %d",pContentLength);
        if (iVar2 == 1) {
          uVar3 = *pContentLength;
          if (-1 < (int)uVar3) {
            free(pcVar5);
            pcVar5 = (char *)calloc((ulong)uVar3 + 1,1);
            *pContent = pcVar5;
            if (pcVar5 != (char *)0x0) {
              iVar4 = recvall(sock,pcVar5,uVar3);
              if (iVar4 == 0) {
                *pBytesReceived = *pBytesReceived + *pContentLength;
                return 0;
              }
              free(*pContent);
              free(*pContentType);
              pcVar5 = *pszStatus;
              goto LAB_00167056;
            }
            free(*pContentType);
            pcVar5 = *pszStatus;
            goto LAB_00167159;
          }
        }
        free(*pContentType);
      }
    }
    free(*pszStatus);
  }
  free(pcVar5);
  return 4;
}

Assistant:

inline int recvsimplehttpresp(SOCKET sock, int* pStatus, char** pszStatus, char** pContentType, int* pContentLength, char** pContent, int maxrecvbuflen, int* pBytesReceived)
{
	int ret = EXIT_FAILURE;
	char* recvbuf = NULL;
	char* ptr = NULL;
	char* ptr2 = NULL;
	int count = 0;
	double httpver = 0;

	*pStatus = 0;
	*pszStatus = NULL;
	*pContentType = NULL;
	*pContentLength = 0;
	*pContent = NULL;
	*pBytesReceived = 0;

	recvbuf = (char*)calloc(maxrecvbuflen+1, 1);
	if (recvbuf == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_OUT_OF_MEMORY],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		return EXIT_OUT_OF_MEMORY;
	}

	// Should enable other line endings...

	ret = recvuntilstr(sock, recvbuf, "\r\n\r\n", maxrecvbuflen, pBytesReceived);
	if (ret != EXIT_SUCCESS)
	{
		free(recvbuf);
		return ret;
	}

	ptr = strstr(recvbuf, "HTTP/");
	if (ptr == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_INVALID_DATA],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(recvbuf);
		return EXIT_INVALID_DATA;
	}

	*pszStatus = (char*)calloc(256, 1);
	if (*pszStatus == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_OUT_OF_MEMORY],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(recvbuf);
		return EXIT_OUT_OF_MEMORY;
	}

	if (sscanf(ptr, "HTTP/%lf %d %[^\r\n]255s", &httpver, pStatus, *pszStatus) != 3)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_INVALID_DATA],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(*pszStatus);
		free(recvbuf);
		return EXIT_INVALID_DATA;
	}

	if (strstrbeginend(ptr, "Content-Type: ", "\r\n", &ptr2, &count) == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_INVALID_DATA],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(*pszStatus);
		free(recvbuf);
		return EXIT_INVALID_DATA;
	}

	*pContentType = (char*)calloc(count+1, 1);
	if (*pContentType == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_OUT_OF_MEMORY],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(*pszStatus);
		free(recvbuf);
		return EXIT_OUT_OF_MEMORY;
	}

	memcpy(*pContentType, ptr2, count);

	ptr = strstr(recvbuf, "Content-Length: ");
	if (ptr == NULL)
	{
		free(*pContentType);
		free(*pszStatus);
		free(recvbuf);
		return EXIT_SUCCESS;
	}
	
	if ((sscanf(ptr, "Content-Length: %d", pContentLength) != 1)||(*pContentLength < 0))
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_INVALID_DATA],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(*pContentType);
		free(*pszStatus);
		free(recvbuf);
		return EXIT_INVALID_DATA;
	}
	
	free(recvbuf);

	*pContent = (char*)calloc(*pContentLength+1, 1);
	if (*pContent == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_OUT_OF_MEMORY],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(*pContentType);
		free(*pszStatus);
		return EXIT_OUT_OF_MEMORY;
	}

	ret = recvall(sock, *pContent, *pContentLength);
	if (ret != EXIT_SUCCESS)
	{
		free(*pContent);
		free(*pContentType);
		free(*pszStatus);
		return ret;
	}

	*pBytesReceived += *pContentLength;

	return EXIT_SUCCESS;
}